

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
          (ConsoleAssertionPrinter *this)

{
  ConsoleAssertionPrinter *this_local;
  
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->messages);
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)&this->messageLabel);
  std::__cxx11::string::~string((string *)&this->passOrFail);
  return;
}

Assistant:

ConsoleAssertionPrinter& operator= (ConsoleAssertionPrinter const&) = delete;